

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O0

void __thiscall cmsys::Directory::Directory(Directory *this)

{
  DirectoryInternals *this_00;
  Directory *this_local;
  
  this_00 = (DirectoryInternals *)operator_new(0x38);
  DirectoryInternals::DirectoryInternals(this_00);
  this->Internal = this_00;
  return;
}

Assistant:

Directory::Directory()
{
  this->Internal = new DirectoryInternals;
}